

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp_nonblock.c
# Opt level: O1

int waitsocket(libssh2_socket_t socket_fd,LIBSSH2_SESSION *session)

{
  int iVar1;
  ulong uVar2;
  fd_set *__readfds;
  fd_set *__writefds;
  timeval timeout;
  fd_set fd;
  timeval local_b8;
  fd_set local_a8;
  
  local_b8.tv_sec = 10;
  local_b8.tv_usec = 0;
  local_a8.fds_bits[0] = 0;
  local_a8.fds_bits[1] = 0;
  local_a8.fds_bits[2] = 0;
  local_a8.fds_bits[3] = 0;
  local_a8.fds_bits[4] = 0;
  local_a8.fds_bits[5] = 0;
  local_a8.fds_bits[6] = 0;
  local_a8.fds_bits[7] = 0;
  local_a8.fds_bits[8] = 0;
  local_a8.fds_bits[9] = 0;
  local_a8.fds_bits[10] = 0;
  local_a8.fds_bits[0xb] = 0;
  local_a8.fds_bits[0xc] = 0;
  local_a8.fds_bits[0xd] = 0;
  local_a8.fds_bits[0xe] = 0;
  local_a8.fds_bits[0xf] = 0;
  iVar1 = socket_fd + 0x3f;
  if (-1 < socket_fd) {
    iVar1 = socket_fd;
  }
  local_a8.fds_bits[iVar1 >> 6] =
       local_a8.fds_bits[iVar1 >> 6] | 1L << ((byte)(socket_fd % 0x40) & 0x3f);
  uVar2 = libssh2_session_block_directions(session);
  __readfds = &local_a8;
  if ((uVar2 & 1) == 0) {
    __readfds = (fd_set *)0x0;
  }
  __writefds = &local_a8;
  if ((uVar2 & 2) == 0) {
    __writefds = (fd_set *)0x0;
  }
  iVar1 = select(socket_fd + 1,__readfds,__writefds,(fd_set *)0x0,&local_b8);
  return iVar1;
}

Assistant:

static int waitsocket(libssh2_socket_t socket_fd, LIBSSH2_SESSION *session)
{
    struct timeval timeout;
    int rc;
    fd_set fd;
    fd_set *writefd = NULL;
    fd_set *readfd = NULL;
    int dir;

    timeout.tv_sec = 10;
    timeout.tv_usec = 0;

    FD_ZERO(&fd);

#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wsign-conversion"
#endif
    FD_SET(socket_fd, &fd);
#if defined(__GNUC__) || defined(__clang__)
#pragma GCC diagnostic pop
#endif

    /* now make sure we wait in the correct direction */
    dir = libssh2_session_block_directions(session);

    if(dir & LIBSSH2_SESSION_BLOCK_INBOUND)
        readfd = &fd;

    if(dir & LIBSSH2_SESSION_BLOCK_OUTBOUND)
        writefd = &fd;

    rc = select((int)(socket_fd + 1), readfd, writefd, NULL, &timeout);

    return rc;
}